

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O2

void init_module_trodesnetwork(void)

{
  self *this;
  class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  *pcVar1;
  class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  *pcVar2;
  class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  *pcVar3;
  class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  *pcVar4;
  class_<HFParsingInfo,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  *this_00;
  class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  *pcVar5;
  class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  *pcVar6;
  class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  *pcVar7;
  class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  *pcVar8;
  class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  *pcVar9;
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  *pcVar10;
  scope local_c8;
  init_base<boost::python::init<mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
  local_b8;
  to_python_converter<lfpPacket,_lfpPacketToList,_false> local_8f;
  to_python_converter<TrodesMsg,_TrodesMsgToList,_false> local_8e;
  to_python_converter<std::vector<HighFreqDataType,_std::allocator<HighFreqDataType>_>,_vecToList<HighFreqDataType>,_false>
  local_8d;
  to_python_converter<std::vector<EventDataType,_std::allocator<EventDataType>_>,_EventVecToDict,_false>
  local_8c;
  to_python_converter<std::vector<int,_std::allocator<int>_>,_vecToList<int>,_false> local_8b;
  to_python_converter<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_vecToList<unsigned_char>,_false>
  local_8a;
  to_python_converter<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_vecToList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_89;
  object_base local_88;
  code *local_80;
  undefined8 local_78;
  code *local_70;
  undefined8 local_68;
  code *local_60;
  undefined8 local_58;
  code *local_50;
  undefined8 local_48;
  code *local_40;
  undefined8 local_38;
  code *local_30;
  undefined8 local_28;
  code *local_20;
  undefined8 local_18;
  
  PyEval_InitThreads();
  Py_Initialize();
  boost::python::numpy::initialize(true);
  boost::python::
  to_python_converter<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_vecToList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  ::to_python_converter(&local_89);
  boost::python::
  to_python_converter<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_vecToList<unsigned_char>,_false>
  ::to_python_converter(&local_8a);
  boost::python::to_python_converter<std::vector<int,_std::allocator<int>_>,_vecToList<int>,_false>
  ::to_python_converter(&local_8b);
  boost::python::
  to_python_converter<std::vector<EventDataType,_std::allocator<EventDataType>_>,_EventVecToDict,_false>
  ::to_python_converter(&local_8c);
  boost::python::
  to_python_converter<std::vector<HighFreqDataType,_std::allocator<HighFreqDataType>_>,_vecToList<HighFreqDataType>,_false>
  ::to_python_converter(&local_8d);
  boost::python::to_python_converter<TrodesMsg,_TrodesMsgToList,_false>::to_python_converter
            (&local_8e);
  boost::python::to_python_converter<lfpPacket,_lfpPacketToList,_false>::to_python_converter
            (&local_8f);
  boost::python::scope::scope(&local_c8);
  *(Py_ssize_t *)local_c8.super_object.super_object_base.m_ptr =
       *(Py_ssize_t *)local_c8.super_object.super_object_base.m_ptr + 1;
  local_b8.m_doc = (char *)local_c8.super_object.super_object_base.m_ptr;
  local_b8.m_keywords.first = (keyword *)0x3a4efe;
  boost::python::api::proxy<boost::python::api::attribute_policies>::operator=
            ((proxy<boost::python::api::attribute_policies> *)&local_b8,(char (*) [7])"Trodes");
  boost::python::api::object_base::~object_base((object_base *)&local_b8);
  boost::python::scope::~scope(&local_c8);
  boost::python::scope::scope(&local_c8);
  *(Py_ssize_t *)local_c8.super_object.super_object_base.m_ptr =
       *(Py_ssize_t *)local_c8.super_object.super_object_base.m_ptr + 1;
  local_b8.m_doc = (char *)local_c8.super_object.super_object_base.m_ptr;
  local_b8.m_keywords.first = (keyword *)0x3a4f10;
  boost::python::api::proxy<boost::python::api::attribute_policies>::operator=
            ((proxy<boost::python::api::attribute_policies> *)&local_b8,
             (char (*) [16])"tcp://127.0.0.1");
  boost::python::api::object_base::~object_base((object_base *)&local_b8);
  boost::python::scope::~scope(&local_c8);
  boost::python::scope::scope(&local_c8);
  *(Py_ssize_t *)local_c8.super_object.super_object_base.m_ptr =
       *(Py_ssize_t *)local_c8.super_object.super_object_base.m_ptr + 1;
  local_b8.m_doc = (char *)local_c8.super_object.super_object_base.m_ptr;
  local_b8.m_keywords.first = (keyword *)0x3a4f27;
  boost::python::api::proxy<boost::python::api::attribute_policies>::operator=
            ((proxy<boost::python::api::attribute_policies> *)&local_b8,&DEFAULT_SERVER_PORT);
  boost::python::api::object_base::~object_base((object_base *)&local_b8);
  boost::python::scope::~scope(&local_c8);
  boost::python::scope::scope(&local_c8);
  *(Py_ssize_t *)local_c8.super_object.super_object_base.m_ptr =
       *(Py_ssize_t *)local_c8.super_object.super_object_base.m_ptr + 1;
  local_b8.m_doc = (char *)local_c8.super_object.super_object_base.m_ptr;
  local_b8.m_keywords.first = (keyword *)0x3a4f3b;
  boost::python::api::proxy<boost::python::api::attribute_policies>::operator=
            ((proxy<boost::python::api::attribute_policies> *)&local_b8,(char (*) [12])"neurostream"
            );
  boost::python::api::object_base::~object_base((object_base *)&local_b8);
  boost::python::scope::~scope(&local_c8);
  boost::python::scope::scope(&local_c8);
  *(Py_ssize_t *)local_c8.super_object.super_object_base.m_ptr =
       *(Py_ssize_t *)local_c8.super_object.super_object_base.m_ptr + 1;
  local_b8.m_doc = (char *)local_c8.super_object.super_object_base.m_ptr;
  local_b8.m_keywords.first = (keyword *)0x3a4f48;
  boost::python::api::proxy<boost::python::api::attribute_policies>::operator=
            ((proxy<boost::python::api::attribute_policies> *)&local_b8,
             (char (*) [13])"analogstream");
  boost::python::api::object_base::~object_base((object_base *)&local_b8);
  boost::python::scope::~scope(&local_c8);
  boost::python::scope::scope(&local_c8);
  *(Py_ssize_t *)local_c8.super_object.super_object_base.m_ptr =
       *(Py_ssize_t *)local_c8.super_object.super_object_base.m_ptr + 1;
  local_b8.m_doc = (char *)local_c8.super_object.super_object_base.m_ptr;
  local_b8.m_keywords.first = (keyword *)0x3a4f55;
  boost::python::api::proxy<boost::python::api::attribute_policies>::operator=
            ((proxy<boost::python::api::attribute_policies> *)&local_b8,
             (char (*) [14])"digitalstream");
  boost::python::api::object_base::~object_base((object_base *)&local_b8);
  boost::python::scope::~scope(&local_c8);
  boost::python::scope::scope(&local_c8);
  *(Py_ssize_t *)local_c8.super_object.super_object_base.m_ptr =
       *(Py_ssize_t *)local_c8.super_object.super_object_base.m_ptr + 1;
  local_b8.m_doc = (char *)local_c8.super_object.super_object_base.m_ptr;
  local_b8.m_keywords.first = (keyword *)0x3a4f63;
  boost::python::api::proxy<boost::python::api::attribute_policies>::operator=
            ((proxy<boost::python::api::attribute_policies> *)&local_b8,(char (*) [12])"spikestream"
            );
  boost::python::api::object_base::~object_base((object_base *)&local_b8);
  boost::python::scope::~scope(&local_c8);
  boost::python::scope::scope(&local_c8);
  *(Py_ssize_t *)local_c8.super_object.super_object_base.m_ptr =
       *(Py_ssize_t *)local_c8.super_object.super_object_base.m_ptr + 1;
  local_b8.m_doc = (char *)local_c8.super_object.super_object_base.m_ptr;
  local_b8.m_keywords.first = (keyword *)0x3a4f6f;
  boost::python::api::proxy<boost::python::api::attribute_policies>::operator=
            ((proxy<boost::python::api::attribute_policies> *)&local_b8,(char (*) [10])"lfpstream");
  boost::python::api::object_base::~object_base((object_base *)&local_b8);
  boost::python::scope::~scope(&local_c8);
  boost::python::scope::scope(&local_c8);
  *(Py_ssize_t *)local_c8.super_object.super_object_base.m_ptr =
       *(Py_ssize_t *)local_c8.super_object.super_object_base.m_ptr + 1;
  local_b8.m_doc = (char *)local_c8.super_object.super_object_base.m_ptr;
  local_b8.m_keywords.first = (keyword *)0x3a4f79;
  boost::python::api::proxy<boost::python::api::attribute_policies>::operator=
            ((proxy<boost::python::api::attribute_policies> *)&local_b8,(char (*) [5])"play");
  boost::python::api::object_base::~object_base((object_base *)&local_b8);
  boost::python::scope::~scope(&local_c8);
  boost::python::scope::scope(&local_c8);
  *(Py_ssize_t *)local_c8.super_object.super_object_base.m_ptr =
       *(Py_ssize_t *)local_c8.super_object.super_object_base.m_ptr + 1;
  local_b8.m_doc = (char *)local_c8.super_object.super_object_base.m_ptr;
  local_b8.m_keywords.first = (keyword *)0x3a4f82;
  boost::python::api::proxy<boost::python::api::attribute_policies>::operator=
            ((proxy<boost::python::api::attribute_policies> *)&local_b8,(char (*) [5])"stop");
  boost::python::api::object_base::~object_base((object_base *)&local_b8);
  boost::python::scope::~scope(&local_c8);
  boost::python::scope::scope(&local_c8);
  *(Py_ssize_t *)local_c8.super_object.super_object_base.m_ptr =
       *(Py_ssize_t *)local_c8.super_object.super_object_base.m_ptr + 1;
  local_b8.m_doc = (char *)local_c8.super_object.super_object_base.m_ptr;
  local_b8.m_keywords.first = (keyword *)0x3a4f8b;
  boost::python::api::proxy<boost::python::api::attribute_policies>::operator=
            ((proxy<boost::python::api::attribute_policies> *)&local_b8,(char (*) [6])"pause");
  boost::python::api::object_base::~object_base((object_base *)&local_b8);
  boost::python::scope::~scope(&local_c8);
  boost::python::scope::scope(&local_c8);
  *(Py_ssize_t *)local_c8.super_object.super_object_base.m_ptr =
       *(Py_ssize_t *)local_c8.super_object.super_object_base.m_ptr + 1;
  local_b8.m_doc = (char *)local_c8.super_object.super_object_base.m_ptr;
  local_b8.m_keywords.first = (keyword *)0x3a4f95;
  boost::python::api::proxy<boost::python::api::attribute_policies>::operator=
            ((proxy<boost::python::api::attribute_policies> *)&local_b8,(char (*) [5])"seek");
  boost::python::api::object_base::~object_base((object_base *)&local_b8);
  boost::python::scope::~scope(&local_c8);
  boost::python::
  class_<timestamp_t,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::class_((class_<timestamp_t,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
            *)&local_b8,"timestamp_t",(char *)0x0);
  this = boost::python::
         class_<timestamp_t,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
         ::add_property<unsigned_int_timestamp_t::*>
                   ((class_<timestamp_t,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
                     *)&local_b8,"trodes_timestamp",0,(char *)0x0);
  boost::python::
  class_<timestamp_t,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::add_property<long_timestamp_t::*>(this,"system_timestamp",8,(char *)0x0);
  boost::python::api::object_base::~object_base((object_base *)&local_b8);
  boost::python::def<long(*)()>("systemTimeMSecs",CZHelp::systemTimeMSecs);
  boost::python::
  class_<HighFreqDataType,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::class_((class_<HighFreqDataType,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
            *)&local_b8,"HighFreqDataType",(char *)0x0);
  pcVar1 = (class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              add_property<std::__cxx11::string(HighFreqDataType::*)()const,void(HighFreqDataType::*)(std::__cxx11::string_const&)>
                        ((class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
                          *)&local_b8,"name",(first_type)HighFreqDataType::getName_abi_cxx11_,0,
                         (char *)HighFreqDataType::setName);
  pcVar1 = (class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              add_property<std::__cxx11::string(HighFreqDataType::*)()const,void(HighFreqDataType::*)(std::__cxx11::string_const&)>
                        (pcVar1,"origin",(first_type)HighFreqDataType::getOrigin_abi_cxx11_,0,
                         (char *)HighFreqDataType::setOrigin);
  pcVar1 = (class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              add_property<std::__cxx11::string(HighFreqDataType::*)()const,void(HighFreqDataType::*)(std::__cxx11::string_const&)>
                        (pcVar1,"dataFormat",(first_type)HighFreqDataType::getDataFormat_abi_cxx11_,
                         0,(char *)HighFreqDataType::setDataFormat);
  pcVar1 = (class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              add_property<std::__cxx11::string(HighFreqDataType::*)()const,void(HighFreqDataType::*)(std::__cxx11::string_const&)>
                        (pcVar1,"address",(first_type)HighFreqDataType::getSockAddr_abi_cxx11_,0,
                         (char *)HighFreqDataType::setSockAddr);
  pcVar1 = (class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::add_property<int(HighFreqDataType::*)()const,void(HighFreqDataType::*)(int)>
                        (pcVar1,"byteSize",(first_type)HighFreqDataType::getByteSize,0,
                         (char *)HighFreqDataType::setByteSize);
  pcVar1 = (class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<bool(HighFreqDataType::*)()const>
                        (pcVar1,"isValid",(first_type)HighFreqDataType::isValid);
  boost::python::
  class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(HighFreqDataType::*)()>(pcVar1,"print",(first_type)HighFreqDataType::print);
  boost::python::api::object_base::~object_base((object_base *)&local_b8);
  local_b8.m_doc = (char *)0x0;
  local_b8.m_keywords.first = (keyword *)0x0;
  local_b8.m_keywords.second = (keyword *)0x0;
  boost::python::
  class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  class_<boost::python::init<mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
            ((class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              *)&local_c8,"StimulationCommand",&local_b8);
  pcVar2 = (class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<bool(StimulationCommand::*)(int)>
                        ((class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
                          *)&local_c8,"setGroup",(first_type)StimulationCommand::setGroup);
  pcVar2 = (class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<void(StimulationCommand::*)()>
                        (pcVar2,"setNoGroup",(first_type)StimulationCommand::setNoGroup);
  pcVar2 = (class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<bool(StimulationCommand::*)(int)>
                        (pcVar2,"setSlot",(first_type)StimulationCommand::setSlot);
  pcVar2 = (class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<bool(StimulationCommand::*)(int,int,int,int)>
                        (pcVar2,"setChannels",(first_type)StimulationCommand::setChannels);
  pcVar2 = (class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              def<unsigned_char(StimulationCommand::*)(unsigned_short,unsigned_char,unsigned_short,unsigned_char,unsigned_short,unsigned_short,unsigned_short)>
                        (pcVar2,"setBiphasicPulseShape",
                         (first_type)StimulationCommand::setBiphasicPulseShape);
  pcVar2 = (class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<void(StimulationCommand::*)(unsigned_short)>
                        (pcVar2,"setNumPulsesInTrain",
                         (first_type)StimulationCommand::setNumPulsesInTrain);
  boost::python::
  class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<bool(StimulationCommand::*)()>(pcVar2,"isValid",(first_type)StimulationCommand::isValid);
  boost::python::api::object_base::~object_base((object_base *)&local_c8);
  boost::python::enum_<GlobalStimulationSettings::CurrentScaling>::enum_
            ((enum_<GlobalStimulationSettings::CurrentScaling> *)&local_b8,"CurrentScaling",
             (char *)0x0);
  boost::python::objects::enum_base::add_value((enum_base *)&local_b8,"max10nA",0);
  boost::python::objects::enum_base::add_value((enum_base *)&local_b8,"max20nA",1);
  boost::python::objects::enum_base::add_value((enum_base *)&local_b8,"max50nA",2);
  boost::python::objects::enum_base::add_value((enum_base *)&local_b8,"max100nA",3);
  boost::python::objects::enum_base::add_value((enum_base *)&local_b8,"max200nA",4);
  boost::python::objects::enum_base::add_value((enum_base *)&local_b8,"max500nA",5);
  boost::python::objects::enum_base::add_value((enum_base *)&local_b8,"max1uA",6);
  boost::python::objects::enum_base::add_value((enum_base *)&local_b8,"max2uA",7);
  boost::python::objects::enum_base::add_value((enum_base *)&local_b8,"max5uA",8);
  boost::python::objects::enum_base::add_value((enum_base *)&local_b8,"max10uA",9);
  boost::python::api::object_base::~object_base((object_base *)&local_b8);
  local_b8.m_doc = (char *)0x0;
  local_b8.m_keywords.first = (keyword *)0x0;
  local_b8.m_keywords.second = (keyword *)0x0;
  boost::python::
  class_<GlobalStimulationSettings,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  class_<boost::python::init<mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
            ((class_<GlobalStimulationSettings,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              *)&local_c8,"GlobalStimulationSettings",&local_b8);
  boost::python::
  class_<GlobalStimulationSettings,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(GlobalStimulationSettings::*)(GlobalStimulationSettings::CurrentScaling)>
            ((class_<GlobalStimulationSettings,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              *)&local_c8,"setVoltageScale",(first_type)GlobalStimulationSettings::setVoltageScale);
  boost::python::api::object_base::~object_base((object_base *)&local_c8);
  local_b8.m_doc = (char *)0x0;
  local_b8.m_keywords.first = (keyword *)0x0;
  local_b8.m_keywords.second = (keyword *)0x0;
  boost::python::
  class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  class_<boost::python::init<mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
            ((class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              *)&local_c8,"GlobalStimulationCommand",&local_b8);
  pcVar3 = (class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<void(GlobalStimulationCommand::*)(bool)>
                        ((class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
                          *)&local_c8,"setStimEnabled",
                         (first_type)GlobalStimulationCommand::setStimEnabled);
  pcVar3 = (class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<void(GlobalStimulationCommand::*)()>
                        (pcVar3,"setResetSequencer",
                         (first_type)GlobalStimulationCommand::setResetSequencer);
  pcVar3 = (class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<void(GlobalStimulationCommand::*)()>
                        (pcVar3,"setAbortStimulation",
                         (first_type)GlobalStimulationCommand::setAbortStimulation);
  boost::python::
  class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(GlobalStimulationCommand::*)()>
            (pcVar3,"setClearDSPOffset",(first_type)GlobalStimulationCommand::setClearDSPOffset);
  boost::python::api::object_base::~object_base((object_base *)&local_c8);
  local_b8.m_doc = (char *)0x0;
  local_b8.m_keywords.first = (keyword *)0x0;
  local_b8.m_keywords.second = (keyword *)0x0;
  boost::python::
  class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  class_<boost::python::init<HighFreqDataType,int,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
            ((class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
              *)&local_c8,"HFSubConsumer",
             (init_base<boost::python::init<HighFreqDataType,_int,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
              *)&local_b8);
  pcVar4 = (class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<void(HFSubConsumer::*)()>
                        ((class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
                          *)&local_c8,"initialize",0x11);
  pcVar4 = (class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<unsigned_long(HFSubConsumer::*)(boost::python::numpy::ndarray)>
                        (pcVar4,"readData",(first_type)HFSubConsumer_python::readData_python);
  pcVar4 = (class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<unsigned_long(HFSubConsumer::*)(long)>
                        (pcVar4,"available",(first_type)HFSubConsumer::available);
  pcVar4 = (class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<HighFreqDataType(HighFreqSub::*)()>
                        (pcVar4,"getDataType",(first_type)HighFreqSub::getType);
  boost::python::
  class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<long(HFSubConsumer::*)()const>
            (pcVar4,"lastSysTimestamp",(first_type)HFSubConsumer::lastSysTimestamp);
  boost::python::api::object_base::~object_base((object_base *)&local_c8);
  boost::python::
  class_<HFParsingInfo,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::class_((class_<HFParsingInfo,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
            *)&local_b8,"HFParsingInfo",(char *)0x0);
  this_00 = (class_<HFParsingInfo,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<HFParsingInfo,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def_readwrite_impl<std::vector<int,std::allocator<int>>,HFParsingInfo>
                         ((class_<HFParsingInfo,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
                           *)&local_b8,"indices",0,(char *)0x0);
  boost::python::
  class_<HFParsingInfo,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def_readwrite_impl<unsigned_long,HFParsingInfo>(this_00,"sizeOf",0x18,(char *)0x0);
  boost::python::api::object_base::~object_base((object_base *)&local_b8);
  local_b8.m_doc = (char *)0x0;
  local_b8.m_keywords.first = (keyword *)0x0;
  local_b8.m_keywords.second = (keyword *)0x0;
  boost::python::
  class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  class_<boost::python::init<HighFreqDataType,int,HFParsingInfo,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
            ((class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              *)&local_c8,"LFPConsumer",
             (init_base<boost::python::init<HighFreqDataType,_int,_HFParsingInfo,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
              *)&local_b8);
  pcVar5 = (class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<void(LFPConsumer::*)()>
                        ((class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
                          *)&local_c8,"initialize",0x11);
  pcVar5 = (class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<timestamp_t(LFPConsumer_python::*)()>
                        (pcVar5,"getData",(first_type)LFPConsumer_python::getData_python);
  pcVar5 = (class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<unsigned_long(HFSubConsumer::*)(long)>
                        (pcVar5,"available",(first_type)HFSubConsumer::available);
  pcVar5 = (class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<boost::python::numpy::ndarray(LFPConsumer_python::*)()>
                        (pcVar5,"create_numpy_array",
                         (first_type)LFPConsumer_python::create_numpy_array);
  pcVar5 = (class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<long(HFSubConsumer::*)()const>
                        (pcVar5,"lastSysTimestamp",(first_type)HFSubConsumer::lastSysTimestamp);
  boost::python::
  class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  def<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>(LFPConsumer::*)()const>
            (pcVar5,"getNTrodesRequested",(first_type)LFPConsumer::getNTrodesRequested_abi_cxx11_);
  boost::python::api::object_base::~object_base((object_base *)&local_c8);
  local_b8.m_doc = (char *)0x0;
  local_b8.m_keywords.first = (keyword *)0x0;
  local_b8.m_keywords.second = (keyword *)0x0;
  boost::python::
  class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  class_<boost::python::init<HighFreqDataType,int,HFParsingInfo,int,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
            ((class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              *)&local_c8,"SpikesConsumer",
             (init_base<boost::python::init<HighFreqDataType,_int,_HFParsingInfo,_int,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
              *)&local_b8);
  pcVar6 = (class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<void(SpikesConsumer::*)()>
                        ((class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
                          *)&local_c8,"initialize",0x11);
  pcVar6 = (class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<timestamp_t(SpikesConsumer_python::*)()>
                        (pcVar6,"getData",(first_type)SpikesConsumer_python::getData_python);
  pcVar6 = (class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<unsigned_long(HFSubConsumer::*)(long)>
                        (pcVar6,"available",(first_type)HFSubConsumer::available);
  pcVar6 = (class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<boost::python::numpy::ndarray(SpikesConsumer_python::*)()>
                        (pcVar6,"create_numpy_array",
                         (first_type)SpikesConsumer_python::create_numpy_array);
  pcVar6 = (class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<long(HFSubConsumer::*)()const>
                        (pcVar6,"lastSysTimestamp",(first_type)HFSubConsumer::lastSysTimestamp);
  boost::python::
  class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  def<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>(SpikesConsumer::*)()const>
            (pcVar6,"getNTrodesRequested",(first_type)SpikesConsumer::getNTrodesRequested_abi_cxx11_
            );
  boost::python::api::object_base::~object_base((object_base *)&local_c8);
  local_b8.m_doc = (char *)0x0;
  local_b8.m_keywords.first = (keyword *)0x0;
  local_b8.m_keywords.second = (keyword *)0x0;
  boost::python::
  class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  class_<boost::python::init<HighFreqDataType,int,HFParsingInfo,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
            ((class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              *)&local_c8,"AnalogConsumer",
             (init_base<boost::python::init<HighFreqDataType,_int,_HFParsingInfo,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
              *)&local_b8);
  pcVar7 = (class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<void(AnalogConsumer::*)()>
                        ((class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
                          *)&local_c8,"initialize",0x11);
  pcVar7 = (class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<timestamp_t(AnalogConsumer_python::*)()>
                        (pcVar7,"getData",(first_type)AnalogConsumer_python::getData_python);
  pcVar7 = (class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<unsigned_long(HFSubConsumer::*)(long)>
                        (pcVar7,"available",(first_type)HFSubConsumer::available);
  pcVar7 = (class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<boost::python::numpy::ndarray(AnalogConsumer_python::*)()>
                        (pcVar7,"create_numpy_array",
                         (first_type)AnalogConsumer_python::create_numpy_array);
  pcVar7 = (class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<long(HFSubConsumer::*)()const>
                        (pcVar7,"lastSysTimestamp",(first_type)HFSubConsumer::lastSysTimestamp);
  boost::python::
  class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  def<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>(AnalogConsumer::*)()const>
            (pcVar7,"getChannelsRequested",
             (first_type)AnalogConsumer::getChannelsRequested_abi_cxx11_);
  boost::python::api::object_base::~object_base((object_base *)&local_c8);
  local_b8.m_doc = (char *)0x0;
  local_b8.m_keywords.first = (keyword *)0x0;
  local_b8.m_keywords.second = (keyword *)0x0;
  boost::python::
  class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  class_<boost::python::init<HighFreqDataType,int,HFParsingInfo,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
            ((class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              *)&local_c8,"AnalogConsumer",
             (init_base<boost::python::init<HighFreqDataType,_int,_HFParsingInfo,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
              *)&local_b8);
  pcVar8 = (class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<void(DigitalConsumer::*)()>
                        ((class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
                          *)&local_c8,"initialize",0x11);
  pcVar8 = (class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<timestamp_t(DigitalConsumer_python::*)()>
                        (pcVar8,"getData",(first_type)DigitalConsumer_python::getData_python);
  pcVar8 = (class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<unsigned_long(HFSubConsumer::*)(long)>
                        (pcVar8,"available",(first_type)HFSubConsumer::available);
  pcVar8 = (class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<boost::python::numpy::ndarray(DigitalConsumer_python::*)()>
                        (pcVar8,"create_numpy_array",
                         (first_type)DigitalConsumer_python::create_numpy_array);
  pcVar8 = (class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<long(HFSubConsumer::*)()const>
                        (pcVar8,"lastSysTimestamp",(first_type)HFSubConsumer::lastSysTimestamp);
  boost::python::
  class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  def<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>(DigitalConsumer::*)()const>
            (pcVar8,"getChannelsRequested",
             (first_type)DigitalConsumer::getChannelsRequested_abi_cxx11_);
  boost::python::api::object_base::~object_base((object_base *)&local_c8);
  local_b8.m_doc = (char *)0x0;
  local_b8.m_keywords.first = (keyword *)0x0;
  local_b8.m_keywords.second = (keyword *)0x0;
  boost::python::
  class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  class_<boost::python::init<HighFreqDataType,int,HFParsingInfo,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
            ((class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              *)&local_c8,"NeuralConsumer",
             (init_base<boost::python::init<HighFreqDataType,_int,_HFParsingInfo,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
              *)&local_b8);
  pcVar9 = (class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<void(NeuralConsumer::*)()>
                        ((class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
                          *)&local_c8,"initialize",0x11);
  pcVar9 = (class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<timestamp_t(NeuralConsumer_python::*)()>
                        (pcVar9,"getData",(first_type)NeuralConsumer_python::getData_python);
  pcVar9 = (class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<unsigned_long(HFSubConsumer::*)(long)>
                        (pcVar9,"available",(first_type)HFSubConsumer::available);
  pcVar9 = (class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<boost::python::numpy::ndarray(NeuralConsumer_python::*)()>
                        (pcVar9,"create_numpy_array",
                         (first_type)NeuralConsumer_python::create_numpy_array);
  pcVar9 = (class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<long(HFSubConsumer::*)()const>
                        (pcVar9,"lastSysTimestamp",(first_type)HFSubConsumer::lastSysTimestamp);
  boost::python::
  class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  def<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>(NeuralConsumer::*)()const>
            (pcVar9,"getChannelsRequested",
             (first_type)NeuralConsumer::getChannelsRequested_abi_cxx11_);
  boost::python::api::object_base::~object_base((object_base *)&local_c8);
  local_b8.m_doc = (char *)0x0;
  local_b8.m_keywords.first = (keyword *)0x0;
  local_b8.m_keywords.second = (keyword *)0x0;
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  class_<boost::python::init<std::__cxx11::string,std::__cxx11::string,int,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
            ((class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
              *)&local_88,"AbstractModuleClient",
             (init_base<boost::python::init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
              *)&local_b8);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<void(PythonModuleClient::*)()>
                         ((class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
                           *)&local_88,"closeConnections",
                          (first_type)PythonModuleClient::close_python);
  local_c8.super_object.super_object_base.m_ptr =
       (object_base)PythonModuleClient::default_recv_acquisition;
  local_c8.m_previous_scope = (PyObject *)0x0;
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::
               def<void(AbstractModuleClient::*)(std::__cxx11::string,unsigned_int),void(PythonModuleClient::*)(std::__cxx11::string,unsigned_int)>
                         (pcVar10,"recv_acquisition",0x59,(first_type *)0x0);
  local_20 = PythonModuleClient::default_recv_file_open;
  local_18 = 0;
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::
               def<void(AbstractModuleClient::*)(std::__cxx11::string),void(PythonModuleClient::*)(std::__cxx11::string)>
                         (pcVar10,"recv_file_open",0x49,(first_type *)0x0);
  local_30 = PythonModuleClient::default_recv_file_close;
  local_28 = 0;
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<void(AbstractModuleClient::*)(),void(PythonModuleClient::*)()>
                         (pcVar10,"recv_file_close",0x51,(first_type *)0x0);
  local_40 = PythonModuleClient::default_recv_source;
  local_38 = 0;
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::
               def<void(AbstractModuleClient::*)(std::__cxx11::string),void(PythonModuleClient::*)(std::__cxx11::string)>
                         (pcVar10,"recv_source",0x61,(first_type *)0x0);
  local_50 = PythonModuleClient::default_recv_quit;
  local_48 = 0;
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<void(AbstractModuleClient::*)(),void(PythonModuleClient::*)()>
                         (pcVar10,"recv_quit",0x69,(first_type *)0x0);
  local_60 = PythonModuleClient::default_recv_time;
  local_58 = 0;
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::
               def<void(AbstractModuleClient::*)(unsigned_int),void(PythonModuleClient::*)(unsigned_int)>
                         (pcVar10,"recv_time",0x71,(first_type *)0x0);
  local_70 = PythonModuleClient::default_recv_timerate;
  local_68 = 0;
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<void(AbstractModuleClient::*)(int),void(PythonModuleClient::*)(int)>
                         (pcVar10,"recv_timerate",0x79,(first_type *)0x0);
  local_80 = PythonModuleClient::default_recv_event;
  local_78 = 0;
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::
               def<void(AbstractModuleClient::*)(std::__cxx11::string,std::__cxx11::string,TrodesMsg&),void(PythonModuleClient::*)(std::__cxx11::string,std::__cxx11::string,TrodesMsg&)>
                         (pcVar10,"recv_event",0x81,(first_type *)0x0);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<int(MlmWrap::*)()>(pcVar10,"initialize",(first_type)MlmWrap::initialize);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<void(AbstractModuleClient::*)(std::__cxx11::string,std::__cxx11::string)>
                         (pcVar10,"subscribeToEvent",
                          (first_type)AbstractModuleClient::subscribeToEvent);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<void(AbstractModuleClient::*)(std::__cxx11::string,std::__cxx11::string)>
                         (pcVar10,"unsubscribeFromEvent",
                          (first_type)AbstractModuleClient::unsubscribeFromEvent);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::
               def<void(PythonModuleClient::*)(boost::python::str,boost::python::str,boost::python::list&)>
                         (pcVar10,"sendMsgToTrodes",
                          (first_type)PythonModuleClient::sendMsgToTrodes_python);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::
               def<void(PythonModuleClient::*)(boost::python::str,boost::python::str,boost::python::str,boost::python::list&)>
                         (pcVar10,"sendMsgToModule",
                          (first_type)PythonModuleClient::sendMsgToModule_python);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::
               def<void(PythonModuleClient::*)(boost::python::str,boost::python::str,boost::python::list&)>
                         (pcVar10,"sendOutEvent",(first_type)PythonModuleClient::sendOutEvent_python
                         );
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<void(AbstractModuleClient::*)()>
                         (pcVar10,"sendTimeRequest",
                          (first_type)AbstractModuleClient::sendTimeRequest);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<void(AbstractModuleClient::*)()>
                         (pcVar10,"sendTimeRateRequest",
                          (first_type)AbstractModuleClient::sendTimeRateRequest);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<std::__cxx11::string(MlmWrap::*)()const>
                         (pcVar10,"getID",(first_type)MlmWrap::getID_abi_cxx11_);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::
               def<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>(MlmWrap::*)()>
                         (pcVar10,"getClients",(first_type)MlmWrap::getClients_abi_cxx11_);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<int(MlmWrap::*)(HighFreqDataType)>
                         (pcVar10,"registerHighFreqData",(first_type)MlmWrap::registerHighFreqData);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<int(MlmWrap::*)(HighFreqDataType)>
                         (pcVar10,"deregisterHighFreqData",
                          (first_type)MlmWrap::deregisterHighFreqData);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<std::vector<HighFreqDataType,std::allocator<HighFreqDataType>>(MlmWrap::*)()>
                         (pcVar10,"getHighFreqList",(first_type)MlmWrap::getHighFreqList);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::
               def<HFSubConsumer*(PythonModuleClient::*)(std::__cxx11::string,std::__cxx11::string,unsigned_long),boost::python::return_value_policy<boost::python::manage_new_object,boost::python::default_call_policies>>
                         (pcVar10,"subscribeHighFreqData",
                          (first_type)PythonModuleClient::subhfd_python,
                          (return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>
                           *)0x0);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::
               def<HFSubConsumer*(PythonModuleClient::*)(std::__cxx11::string,std::__cxx11::string),boost::python::return_value_policy<boost::python::manage_new_object,boost::python::default_call_policies>>
                         (pcVar10,"subscribeHighFreqData",
                          (first_type)PythonModuleClient::subhfd_default_python,
                          (return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>
                           *)0x0);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<int(AbstractModuleClient::*)(std::__cxx11::string,std::__cxx11::string)>
                         (pcVar10,"unsubscribeHighFreqData",
                          (first_type)AbstractModuleClient::unsubscribeHighFreqData);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<int(MlmWrap::*)(char_const*)>
                         (pcVar10,"provideEvent",(first_type)MlmWrap::provideEvent);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<int(MlmWrap::*)(char_const*)>
                         (pcVar10,"unprovideEvent",(first_type)MlmWrap::unprovideEvent);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<std::vector<EventDataType,std::allocator<EventDataType>>(MlmWrap::*)()>
                         (pcVar10,"getEventList",(first_type)MlmWrap::getEventList);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::
               def<LFPConsumer_python*(PythonModuleClient::*)(unsigned_long,boost::python::list&),boost::python::return_value_policy<boost::python::manage_new_object,boost::python::default_call_policies>>
                         (pcVar10,"subscribeLFPData",
                          (first_type)PythonModuleClient::sublfpdata_python,
                          (return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>
                           *)0x0);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::
               def<SpikesConsumer_python*(PythonModuleClient::*)(unsigned_long,boost::python::list&),boost::python::return_value_policy<boost::python::manage_new_object,boost::python::default_call_policies>>
                         (pcVar10,"subscribeSpikesData",
                          (first_type)PythonModuleClient::subspikesdata_python,
                          (return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>
                           *)0x0);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::
               def<AnalogConsumer_python*(PythonModuleClient::*)(unsigned_long,boost::python::list&),boost::python::return_value_policy<boost::python::manage_new_object,boost::python::default_call_policies>>
                         (pcVar10,"subscribeAnalogData",
                          (first_type)PythonModuleClient::subanalogdata_python,
                          (return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>
                           *)0x0);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::
               def<DigitalConsumer_python*(PythonModuleClient::*)(unsigned_long,boost::python::list&),boost::python::return_value_policy<boost::python::manage_new_object,boost::python::default_call_policies>>
                         (pcVar10,"subscribeDigitalData",
                          (first_type)PythonModuleClient::subdigitaldata_python,
                          (return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>
                           *)0x0);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::
               def<NeuralConsumer_python*(PythonModuleClient::*)(unsigned_long,boost::python::list&),boost::python::return_value_policy<boost::python::manage_new_object,boost::python::default_call_policies>>
                         (pcVar10,"subscribeNeuralData",
                          (first_type)PythonModuleClient::subneuraldata_python,
                          (return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>
                           *)0x0);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::
               def<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>(AbstractModuleClient::*)(std::__cxx11::string)>
                         (pcVar10,"getAvailableTrodesData",
                          (first_type)AbstractModuleClient::getAvailableTrodesData);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<bool(AbstractModuleClient::*)()>
                         (pcVar10,"initializeHardwareConnection",
                          (first_type)AbstractModuleClient::initializeHardwareConnection);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<void(AbstractModuleClient::*)()>
                         (pcVar10,"destroyHardwareConnection",
                          (first_type)AbstractModuleClient::destroyHardwareConnection);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<bool(AbstractModuleClient::*)()>
                         (pcVar10,"sendSettleCommand",
                          (first_type)AbstractModuleClient::sendSettleCommand);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<bool(AbstractModuleClient::*)(StimulationCommand)>
                         (pcVar10,"sendStimulationParams",
                          (first_type)AbstractModuleClient::sendStimulationParams);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<bool(AbstractModuleClient::*)(unsigned_short)>
                         (pcVar10,"sendClearStimulationParams",
                          (first_type)AbstractModuleClient::sendClearStimulationParams);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<bool(AbstractModuleClient::*)(unsigned_short)>
                         (pcVar10,"sendStimulationStartSlot",
                          (first_type)AbstractModuleClient::sendStimulationStartSlot);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<bool(AbstractModuleClient::*)(unsigned_short)>
                         (pcVar10,"sendStimulationStartGroup",
                          (first_type)AbstractModuleClient::sendStimulationStartGroup);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<bool(AbstractModuleClient::*)(unsigned_short)>
                         (pcVar10,"sendStimulationStopSlot",
                          (first_type)AbstractModuleClient::sendStimulationStopSlot);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<bool(AbstractModuleClient::*)(unsigned_short)>
                         (pcVar10,"sendStimulationStopGroup",
                          (first_type)AbstractModuleClient::sendStimulationStopGroup);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<bool(AbstractModuleClient::*)(GlobalStimulationSettings)>
                         (pcVar10,"sendGlobalStimulationSettings",
                          (first_type)AbstractModuleClient::sendGlobalStimulationSettings);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<bool(AbstractModuleClient::*)(GlobalStimulationCommand)>
                         (pcVar10,"sendGlobalStimulationCommand",
                          (first_type)AbstractModuleClient::sendGlobalStimulationCommand);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<bool(AbstractModuleClient::*)(unsigned_short)>
                         (pcVar10,"sendStateScriptShortcutMessage",
                          (first_type)AbstractModuleClient::sendStateScriptShortcutMessage);
  pcVar10 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<unsigned_int(AbstractModuleClient::*)()>
                         (pcVar10,"latestTrodesTimestamp",
                          (first_type)AbstractModuleClient::latestTrodesTimestamp);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(AbstractModuleClient::*)(std::__cxx11::string)>
            (pcVar10,"sendAnnotationRequest",(first_type)AbstractModuleClient::sendAnnotationRequest
            );
  boost::python::api::object_base::~object_base(&local_88);
  return;
}

Assistant:

BOOST_PYTHON_MODULE(trodesnetwork){
    PyEval_InitThreads();
    Py_Initialize();
    np::initialize();
    to_python_converter<std::vector<std::string>, vecToList<std::string> >();
    to_python_converter<std::vector<byte>, vecToList<byte> >();
    to_python_converter<std::vector<int>, vecToList<int> >();
    to_python_converter<std::vector<EventDataType>, EventVecToDict>();
    to_python_converter<std::vector<HighFreqDataType>, vecToList<HighFreqDataType> >();
    to_python_converter<TrodesMsg, TrodesMsgToList>();
    to_python_converter<lfpPacket, lfpPacketToList>();

    scope().attr("TRODES_NETWORK_ID") = TRODES_NETWORK_ID;
    scope().attr("DEFAULT_SERVER_ADDRESS") = DEFAULT_SERVER_ADDRESS;
    scope().attr("DEFAULT_SERVER_PORT") = DEFAULT_SERVER_PORT;
    scope().attr("NEURALSTREAM") = hfType_NEURO;
    scope().attr("ANALOGSTREAM") = hfType_ANALOG;
    scope().attr("DIGITALSTREAM") = hfType_DIGITAL;
    scope().attr("SPIKESTREAM") = hfType_SPIKE;
    scope().attr("LFPSTREAM") = hfType_LFP;
    scope().attr("acq_PLAY") = acq_PLAY;
    scope().attr("acq_STOP") = acq_STOP;
    scope().attr("acq_PAUSE") = acq_PAUSE;
    scope().attr("acq_SEEK") = acq_SEEK;

//    scope().attr("settle_CMD") = settle_CMD;

    class_<timestamp_t>("timestamp_t")
            .add_property("trodes_timestamp", &timestamp_t::trodes_timestamp)
            .add_property("system_timestamp", &timestamp_t::system_timestamp)
            ;
    def("systemTimeMSecs", &CZHelp::systemTimeMSecs);

    class_<HighFreqDataType>
            ("HighFreqDataType")
            .add_property("name", &HighFreqDataType::getName, &HighFreqDataType::setName)
            .add_property("origin", &HighFreqDataType::getOrigin, &HighFreqDataType::setOrigin)
            .add_property("dataFormat", &HighFreqDataType::getDataFormat, &HighFreqDataType::setDataFormat)
            .add_property("address", &HighFreqDataType::getSockAddr, &HighFreqDataType::setSockAddr)
            .add_property("byteSize", &HighFreqDataType::getByteSize, &HighFreqDataType::setByteSize)
            .def("isValid", &HighFreqDataType::isValid)
            .def("print", &HighFreqDataType::print)
            ;

    class_<StimulationCommand>
            ("StimulationCommand", init<>())
//            .def(init<int, int, int, uint16_t, uint8_t, uint16_t, uint8_t, uint16_t, uint16_t, uint16_t>())
            .def("setGroup", &StimulationCommand::setGroup)
            .def("setNoGroup", &StimulationCommand::setNoGroup)
            .def("setSlot", &StimulationCommand::setSlot)
            .def("setChannels",&StimulationCommand::setChannels)
            .def("setBiphasicPulseShape", &StimulationCommand::setBiphasicPulseShape)
            .def("setNumPulsesInTrain", &StimulationCommand::setNumPulsesInTrain)
            .def("isValid", &StimulationCommand::isValid)
            ;

    enum_<GlobalStimulationSettings::CurrentScaling>("CurrentScaling")
            .value("max10nA", GlobalStimulationSettings::max10nA)
            .value("max20nA", GlobalStimulationSettings::max20nA)
            .value("max50nA", GlobalStimulationSettings::max50nA)
            .value("max100nA", GlobalStimulationSettings::max100nA)
            .value("max200nA", GlobalStimulationSettings::max200nA)
            .value("max500nA", GlobalStimulationSettings::max500nA)
            .value("max1uA", GlobalStimulationSettings::max1uA)
            .value("max2uA", GlobalStimulationSettings::max2uA)
            .value("max5uA", GlobalStimulationSettings::max5uA)
            .value("max10uA", GlobalStimulationSettings::max10uA)
            ;

    class_<GlobalStimulationSettings>("GlobalStimulationSettings", init<>())
            .def("setVoltageScale", &GlobalStimulationSettings::setVoltageScale)
            ;

    class_<GlobalStimulationCommand>("GlobalStimulationCommand", init<>())
            .def("setStimEnabled", &GlobalStimulationCommand::setStimEnabled)
            .def("setResetSequencer", &GlobalStimulationCommand::setResetSequencer)
            .def("setAbortStimulation", &GlobalStimulationCommand::setAbortStimulation)
            .def("setClearDSPOffset", &GlobalStimulationCommand::setClearDSPOffset)
            ;
//    void (HighFreqPub::*pubdatax2)(void, size_t) = &HighFreqPub::publishData;
//    void (HighFreqPub::*pubdatax3)(void, size_t, int64_t) = &HighFreqPub::publishData;
//    class_<HighFreqPub, boost::noncopyable>
//            ("HighFreqPub")
//            .def("initialize", &HighFreqPub::initialize)
//            .def("publishData", pubdatax2)
//            .def("publishData", pubdatax3)
//            .def("getAddress", &HighFreqPub::getAddress)
//            ;

    class_<HFSubConsumer_python, boost::noncopyable>
            ("HFSubConsumer", init<HighFreqDataType, int>())
            .def("initialize", &HFSubConsumer_python::initialize)
            .def("readData", static_cast<size_t (HFSubConsumer::*)(np::ndarray)>(&HFSubConsumer_python::readData_python))
            .def("available", &HFSubConsumer_python::available)
            .def("getDataType", &HFSubConsumer_python::getType)
            .def("lastSysTimestamp", &HFSubConsumer::lastSysTimestamp)
            ;

    class_<HFParsingInfo>("HFParsingInfo")
            .def_readwrite("indices", &HFParsingInfo::indices)
            .def_readwrite("sizeOf", &HFParsingInfo::sizeOf)
            ;

    class_<LFPConsumer_python, bases<HFSubConsumer_python>, boost::noncopyable>
            ("LFPConsumer", init<HighFreqDataType, int, HFParsingInfo>())
            .def("initialize", &LFPConsumer_python::initialize)
            .def("getData", &LFPConsumer_python::getData_python)
            .def("available", &LFPConsumer_python::available)
            .def("create_numpy_array", &LFPConsumer_python::create_numpy_array)
            .def("lastSysTimestamp", &HFSubConsumer::lastSysTimestamp)
            .def("getNTrodesRequested", &LFPConsumer_python::getNTrodesRequested)
            ;

    class_<SpikesConsumer_python, bases<HFSubConsumer_python>, boost::noncopyable>
            ("SpikesConsumer", init<HighFreqDataType, int, HFParsingInfo, int>())
            .def("initialize", &SpikesConsumer_python::initialize)
            .def("getData",&SpikesConsumer_python::getData_python)
            .def("available", &SpikesConsumer_python::available)
            .def("create_numpy_array", &SpikesConsumer_python::create_numpy_array)
            .def("lastSysTimestamp", &HFSubConsumer::lastSysTimestamp)
            .def("getNTrodesRequested", &SpikesConsumer_python::getNTrodesRequested)
            ;

    class_<AnalogConsumer_python, bases<HFSubConsumer_python>, boost::noncopyable>
            ("AnalogConsumer", init<HighFreqDataType, int, HFParsingInfo>())
            .def("initialize", &AnalogConsumer_python::initialize)
            .def("getData",&AnalogConsumer_python::getData_python)
            .def("available", &AnalogConsumer_python::available)
            .def("create_numpy_array", &AnalogConsumer_python::create_numpy_array)
            .def("lastSysTimestamp", &HFSubConsumer::lastSysTimestamp)
            .def("getChannelsRequested", &AnalogConsumer::getChannelsRequested)
            ;

    class_<DigitalConsumer_python, bases<HFSubConsumer_python>, boost::noncopyable>
            ("AnalogConsumer", init<HighFreqDataType, int, HFParsingInfo>())
            .def("initialize", &DigitalConsumer_python::initialize)
            .def("getData",&DigitalConsumer_python::getData_python)
            .def("available", &DigitalConsumer_python::available)
            .def("create_numpy_array", &DigitalConsumer_python::create_numpy_array)
            .def("lastSysTimestamp", &HFSubConsumer::lastSysTimestamp)
            .def("getChannelsRequested", &DigitalConsumer::getChannelsRequested)
            ;

    class_<NeuralConsumer_python, bases<HFSubConsumer_python>, boost::noncopyable>
            ("NeuralConsumer", init<HighFreqDataType, int, HFParsingInfo>())
            .def("initialize", &NeuralConsumer_python::initialize)
            .def("getData",&NeuralConsumer_python::getData_python)
            .def("available", &NeuralConsumer_python::available)
            .def("create_numpy_array", &NeuralConsumer_python::create_numpy_array)
            .def("lastSysTimestamp", &HFSubConsumer::lastSysTimestamp)
            .def("getChannelsRequested", &NeuralConsumer::getChannelsRequested)
            ;

    class_<PythonModuleClient, boost::noncopyable>
        ("AbstractModuleClient", init<std::string, std::string, int>())
        .def("closeConnections", &PythonModuleClient::close_python)
        .def("recv_acquisition", &AbstractModuleClient::recv_acquisition,&PythonModuleClient::default_recv_acquisition)
        .def("recv_file_open", &AbstractModuleClient::recv_file_open,&PythonModuleClient::default_recv_file_open)
        .def("recv_file_close", &AbstractModuleClient::recv_file_close,&PythonModuleClient::default_recv_file_close)
        .def("recv_source", &AbstractModuleClient::recv_source,&PythonModuleClient::default_recv_source)
        .def("recv_quit", &AbstractModuleClient::recv_quit,&PythonModuleClient::default_recv_quit)
        .def("recv_time", &AbstractModuleClient::recv_time,&PythonModuleClient::default_recv_time)
        .def("recv_timerate", &AbstractModuleClient::recv_timerate,&PythonModuleClient::default_recv_timerate)
        .def("recv_event", &AbstractModuleClient::recv_event,&PythonModuleClient::default_recv_event)
        .def("initialize", &PythonModuleClient::initialize)
        .def("subscribeToEvent", &PythonModuleClient::subscribeToEvent)
        .def("unsubscribeFromEvent", &PythonModuleClient::unsubscribeFromEvent)
        .def("sendMsgToTrodes", &PythonModuleClient::sendMsgToTrodes_python)
        .def("sendMsgToModule", &PythonModuleClient::sendMsgToModule_python)
        .def("sendOutEvent", &PythonModuleClient::sendOutEvent_python)
        .def("sendTimeRequest", &PythonModuleClient::sendTimeRequest)
        .def("sendTimeRateRequest", &PythonModuleClient::sendTimeRateRequest)
        .def("getID", &PythonModuleClient::getID)
        .def("getClients", &PythonModuleClient::getClients)
        .def("registerHighFreqData", &PythonModuleClient::registerHighFreqData)
        .def("deregisterHighFreqData", &PythonModuleClient::deregisterHighFreqData)
        .def("getHighFreqList", &PythonModuleClient::getHighFreqList)
        .def("subscribeHighFreqData", &PythonModuleClient::subhfd_python, return_value_policy<manage_new_object>())
        .def("subscribeHighFreqData", &PythonModuleClient::subhfd_default_python, return_value_policy<manage_new_object>())
        .def("unsubscribeHighFreqData", &PythonModuleClient::unsubscribeHighFreqData)
        .def("provideEvent", &PythonModuleClient::provideEvent)
        .def("unprovideEvent",&PythonModuleClient::unprovideEvent)
        .def("getEventList", &PythonModuleClient::getEventList)
        .def("subscribeLFPData", &PythonModuleClient::sublfpdata_python, return_value_policy<manage_new_object>())
        .def("subscribeSpikesData", &PythonModuleClient::subspikesdata_python, return_value_policy<manage_new_object>())
        .def("subscribeAnalogData", &PythonModuleClient::subanalogdata_python, return_value_policy<manage_new_object>())
        .def("subscribeDigitalData", &PythonModuleClient::subdigitaldata_python, return_value_policy<manage_new_object>())
        .def("subscribeNeuralData", &PythonModuleClient::subneuraldata_python, return_value_policy<manage_new_object>())
        .def("getAvailableTrodesData", &PythonModuleClient::getAvailableTrodesData)
        .def("initializeHardwareConnection", &PythonModuleClient::initializeHardwareConnection)
        .def("destroyHardwareConnection", &PythonModuleClient::destroyHardwareConnection)
        .def("sendSettleCommand", &PythonModuleClient::sendSettleCommand)
        .def("sendStimulationParams", &PythonModuleClient::sendStimulationParams)
        .def("sendClearStimulationParams", &PythonModuleClient::sendClearStimulationParams)
        .def("sendStimulationStartSlot", &PythonModuleClient::sendStimulationStartSlot)
        .def("sendStimulationStartGroup",&PythonModuleClient::sendStimulationStartGroup)
        .def("sendStimulationStopSlot", &PythonModuleClient::sendStimulationStopSlot)
        .def("sendStimulationStopGroup",&PythonModuleClient::sendStimulationStopGroup)
        .def("sendGlobalStimulationSettings", &PythonModuleClient::sendGlobalStimulationSettings)
        .def("sendGlobalStimulationCommand", &PythonModuleClient::sendGlobalStimulationCommand)
        .def("sendStateScriptShortcutMessage", &PythonModuleClient::sendStateScriptShortcutMessage)
        .def("latestTrodesTimestamp", &PythonModuleClient::latestTrodesTimestamp)
        .def("sendAnnotationRequest", &PythonModuleClient::sendAnnotationRequest)
        ;
}